

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_set_module_version(int major,int minor,int patch,char *tag)

{
  size_t sVar1;
  arg_dstr_t ds_00;
  char *pcVar2;
  char *__src;
  arg_dstr_t ds;
  size_t slen_ds;
  size_t slen_tag;
  char *tag_local;
  int patch_local;
  int minor_local;
  int major_local;
  
  s_mod_ver_major = major;
  s_mod_ver_minor = minor;
  s_mod_ver_patch = patch;
  argtable3_xfree(s_mod_ver_tag);
  sVar1 = strlen(tag);
  s_mod_ver_tag = (char *)argtable3_xmalloc(sVar1 + 1);
  memset(s_mod_ver_tag,0,sVar1 + 1);
  memcpy(s_mod_ver_tag,tag,sVar1);
  ds_00 = arg_dstr_create();
  arg_dstr_catf(ds_00,"%d.",(ulong)(uint)s_mod_ver_major);
  arg_dstr_catf(ds_00,"%d.",(ulong)(uint)s_mod_ver_minor);
  arg_dstr_catf(ds_00,"%d.",(ulong)(uint)s_mod_ver_patch);
  arg_dstr_cat(ds_00,s_mod_ver_tag);
  argtable3_xfree(s_mod_ver);
  pcVar2 = arg_dstr_cstr(ds_00);
  sVar1 = strlen(pcVar2);
  s_mod_ver = (char *)argtable3_xmalloc(sVar1 + 1);
  memset(s_mod_ver,0,sVar1 + 1);
  pcVar2 = s_mod_ver;
  __src = arg_dstr_cstr(ds_00);
  memcpy(pcVar2,__src,sVar1);
  arg_dstr_destroy(ds_00);
  return;
}

Assistant:

void arg_set_module_version(int major, int minor, int patch, const char* tag) {
    size_t slen_tag, slen_ds;
    arg_dstr_t ds;

    s_mod_ver_major = major;
    s_mod_ver_minor = minor;
    s_mod_ver_patch = patch;

    xfree(s_mod_ver_tag);
    slen_tag = strlen(tag);
    s_mod_ver_tag = (char*)xmalloc(slen_tag + 1);
    memset(s_mod_ver_tag, 0, slen_tag + 1);

#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
    strncpy_s(s_mod_ver_tag, slen_tag + 1, tag, slen_tag);
#else
    memcpy(s_mod_ver_tag, tag, slen_tag);
#endif

    ds = arg_dstr_create();
    arg_dstr_catf(ds, "%d.", s_mod_ver_major);
    arg_dstr_catf(ds, "%d.", s_mod_ver_minor);
    arg_dstr_catf(ds, "%d.", s_mod_ver_patch);
    arg_dstr_cat(ds, s_mod_ver_tag);

    xfree(s_mod_ver);
    slen_ds = strlen(arg_dstr_cstr(ds));
    s_mod_ver = (char*)xmalloc(slen_ds + 1);
    memset(s_mod_ver, 0, slen_ds + 1);

#if (defined(__STDC_LIB_EXT1__) && defined(__STDC_WANT_LIB_EXT1__)) || (defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__))
    strncpy_s(s_mod_ver, slen_ds + 1, arg_dstr_cstr(ds), slen_ds);
#else
    memcpy(s_mod_ver, arg_dstr_cstr(ds), slen_ds);
#endif

    arg_dstr_destroy(ds);
}